

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

bool __thiscall QListWidgetItem::isSelected(QListWidgetItem *this)

{
  byte bVar1;
  QListModel *__s;
  QItemSelectionModel *pQVar2;
  QListWidgetItem *in_RDI;
  long in_FS_OFFSET;
  QListModel *model;
  QModelIndex index;
  bool local_21;
  undefined1 *local_20;
  undefined1 *local_18;
  Data *local_10;
  QListWidgetItem **local_8;
  
  local_8 = *(QListWidgetItem ***)(in_FS_OFFSET + 0x28);
  __s = listModel(in_RDI);
  if (__s != (QListModel *)0x0) {
    pQVar2 = QAbstractItemView::selectionModel((QAbstractItemView *)in_RDI);
    if (pQVar2 != (QItemSelectionModel *)0x0) {
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QListModel::index((QListModel *)&local_20,(char *)__s,(int)in_RDI);
      pQVar2 = QAbstractItemView::selectionModel((QAbstractItemView *)in_RDI);
      bVar1 = QItemSelectionModel::isSelected((QModelIndex *)pQVar2);
      local_21 = (bool)(bVar1 & 1);
      goto LAB_0089c87b;
    }
  }
  local_21 = false;
LAB_0089c87b:
  if (*(QListWidgetItem ***)(in_FS_OFFSET + 0x28) == local_8) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QListWidgetItem::isSelected() const
{
    const QListModel *model = listModel();
    if (!model || !view->selectionModel())
        return false;
    const QModelIndex index = model->index(this);
    return view->selectionModel()->isSelected(index);
}